

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall llbuild::buildsystem::BuildSystem::~BuildSystem(BuildSystem *this)

{
  BuildSystemImpl *this_00;
  BuildSystem *this_local;
  
  this_00 = (BuildSystemImpl *)this->impl;
  if (this_00 != (BuildSystemImpl *)0x0) {
    anon_unknown.dwarf_ecf33::BuildSystemImpl::~BuildSystemImpl(this_00);
    operator_delete(this_00,0x138);
  }
  return;
}

Assistant:

BuildSystem::~BuildSystem() {
  delete static_cast<BuildSystemImpl*>(impl);
}